

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::set_external_address
          (session_impl *this,endpoint *param_1,address *ip,ip_source_t source_type,address *source)

{
  bool bVar1;
  undefined7 in_register_00000009;
  __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  __it;
  long lVar2;
  __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  sock;
  long lVar3;
  endpoint *local_58;
  undefined4 local_4c;
  pointer local_48;
  address *local_40;
  address *local_38;
  
  local_4c = (undefined4)CONCAT71(in_register_00000009,source_type.m_val);
  __it._M_current =
       (this->m_listen_sockets).
       super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48 = (this->m_listen_sockets).
             super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  lVar2 = (long)local_48 - (long)__it._M_current;
  local_58 = param_1;
  local_40 = ip;
  local_38 = source;
  for (lVar3 = lVar2 >> 6; 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::$_0>
            ::operator()((_Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::__0>
                          *)&local_58,__it);
    sock._M_current = __it._M_current;
    if (bVar1) goto LAB_0029874b;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::$_0>
            ::operator()((_Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::__0>
                          *)&local_58,__it._M_current + 1);
    sock._M_current = __it._M_current + 1;
    if (bVar1) goto LAB_0029874b;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::$_0>
            ::operator()((_Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::__0>
                          *)&local_58,__it._M_current + 2);
    sock._M_current = __it._M_current + 2;
    if (bVar1) goto LAB_0029874b;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::$_0>
            ::operator()((_Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::__0>
                          *)&local_58,__it._M_current + 3);
    sock._M_current = __it._M_current + 3;
    if (bVar1) goto LAB_0029874b;
    __it._M_current = __it._M_current + 4;
    lVar2 = lVar2 + -0x40;
  }
  lVar2 = lVar2 >> 4;
  if (lVar2 != 1) {
    if (lVar2 != 2) {
      sock._M_current = local_48;
      if ((lVar2 != 3) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::$_0>
                  ::operator()((_Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::__0>
                                *)&local_58,__it), sock._M_current = __it._M_current, bVar1))
      goto LAB_0029874b;
      __it._M_current = __it._M_current + 1;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::$_0>
            ::operator()((_Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::__0>
                          *)&local_58,__it);
    sock._M_current = __it._M_current;
    if (bVar1) goto LAB_0029874b;
    __it._M_current = __it._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::$_0>
          ::operator()((_Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::__0>
                        *)&local_58,__it);
  sock._M_current = local_48;
  if (bVar1) {
    sock._M_current = __it._M_current;
  }
LAB_0029874b:
  if (sock._M_current ==
      (this->m_listen_sockets).
      super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return;
  }
  set_external_address(this,sock._M_current,local_40,local_4c._0_1_,local_38);
  return;
}

Assistant:

void session_impl::set_external_address(
		tcp::endpoint const& local_endpoint, address const& ip
		, ip_source_t const source_type, address const& source)
	{
		auto sock = std::find_if(m_listen_sockets.begin(), m_listen_sockets.end()
			, [&](std::shared_ptr<listen_socket_t> const& v)
			{ return v->local_endpoint.address() == local_endpoint.address(); });

		if (sock != m_listen_sockets.end())
			set_external_address(*sock, ip, source_type, source);
	}